

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X11MiniFB.c
# Opt level: O3

int translate_mod_ex(int key,int state,int is_pressed)

{
  uint uVar1;
  
  uVar1 = ((uint)state >> 3 & 8 | (uint)state >> 1 & 6 | state & 1U) + (state & 2U) * 8 +
          (state & 0x10U) * 2;
  switch(key) {
  case 0x154:
  case 0x158:
    break;
  case 0x155:
  case 0x159:
    if (is_pressed == 0) {
      return uVar1 & 0xfffffffd;
    }
    return uVar1 | 2;
  case 0x156:
  case 0x15a:
    if (is_pressed == 0) {
      return uVar1 & 0xfffffffb;
    }
    return uVar1 | 4;
  case 0x157:
  case 0x15b:
    if (is_pressed != 0) {
      return uVar1 | 8;
    }
    uVar1 = uVar1 & 0xfffffff7;
  default:
    return uVar1;
  }
  if (is_pressed == 0) {
    return uVar1 & 0xfffffffe;
  }
  return uVar1 | 1;
}

Assistant:

int
translate_mod_ex(int key, int state, int is_pressed) {
    int mod_keys = 0;

    mod_keys = translate_mod(state);

    switch (key)
    {
        case KB_KEY_LEFT_SHIFT:
        case KB_KEY_RIGHT_SHIFT:
            if (is_pressed)
                mod_keys |= KB_MOD_SHIFT;
            else
                mod_keys &= ~KB_MOD_SHIFT;
            break;

        case KB_KEY_LEFT_CONTROL:
        case KB_KEY_RIGHT_CONTROL:
            if (is_pressed)
                mod_keys |= KB_MOD_CONTROL;
            else
                mod_keys &= ~KB_MOD_CONTROL;
            break;

        case KB_KEY_LEFT_ALT:
        case KB_KEY_RIGHT_ALT:
            if (is_pressed)
                mod_keys |= KB_MOD_ALT;
            else
                mod_keys &= ~KB_MOD_ALT;
            break;

        case KB_KEY_LEFT_SUPER:
        case KB_KEY_RIGHT_SUPER:
            if (is_pressed)
                mod_keys |= KB_MOD_SUPER;
            else
                mod_keys &= ~KB_MOD_SUPER;
            break;
    }

    return mod_keys;
}